

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

uInt longest_match_fast(deflate_state *s,IPos cur_match)

{
  Bytef *pBVar1;
  Bytef *pBVar2;
  bool bVar3;
  uint local_48;
  Bytef *strend;
  Bytef *pBStack_30;
  int len;
  Bytef *match;
  Bytef *scan;
  IPos cur_match_local;
  deflate_state *s_local;
  
  pBVar1 = s->window + s->strstart;
  pBStack_30 = s->window + cur_match;
  if ((*pBStack_30 == *pBVar1) && (pBStack_30[1] == pBVar1[1])) {
    match = pBVar1 + 2;
    pBStack_30 = pBStack_30 + 2;
    do {
      bVar3 = false;
      pBVar1 = pBStack_30 + 1;
      pBVar2 = match + 1;
      if (match[1] == pBStack_30[1]) {
        bVar3 = false;
        pBVar1 = pBStack_30 + 2;
        pBVar2 = match + 2;
        if (match[2] == pBStack_30[2]) {
          bVar3 = false;
          pBVar1 = pBStack_30 + 3;
          pBVar2 = match + 3;
          if (match[3] == pBStack_30[3]) {
            bVar3 = false;
            pBVar1 = pBStack_30 + 4;
            pBVar2 = match + 4;
            if (match[4] == pBStack_30[4]) {
              bVar3 = false;
              pBVar1 = pBStack_30 + 5;
              pBVar2 = match + 5;
              if (match[5] == pBStack_30[5]) {
                bVar3 = false;
                pBVar1 = pBStack_30 + 6;
                pBVar2 = match + 6;
                if (match[6] == pBStack_30[6]) {
                  bVar3 = false;
                  pBVar1 = pBStack_30 + 7;
                  pBVar2 = match + 7;
                  if (match[7] == pBStack_30[7]) {
                    pBVar2 = match + 8;
                    bVar3 = false;
                    pBVar1 = pBStack_30 + 8;
                    if (match[8] == pBStack_30[8]) {
                      bVar3 = pBVar2 < s->window + (ulong)s->strstart + 0x102;
                    }
                  }
                }
              }
            }
          }
        }
      }
      match = pBVar2;
      pBStack_30 = pBVar1;
    } while (bVar3);
    local_48 = 0x102 - ((int)(s->window + (ulong)s->strstart + 0x102) - (int)match);
    if ((int)local_48 < 3) {
      s_local._4_4_ = 2;
    }
    else {
      s->match_start = cur_match;
      if (s->lookahead < local_48) {
        local_48 = s->lookahead;
      }
      s_local._4_4_ = local_48;
    }
  }
  else {
    s_local._4_4_ = 2;
  }
  return s_local._4_4_;
}

Assistant:

local uInt longest_match_fast(s, cur_match)
    deflate_state *s;
    IPos cur_match;                             /* current match */
{
    register Bytef *scan = s->window + s->strstart; /* current string */
    register Bytef *match;                       /* matched string */
    register int len;                           /* length of current match */
    register Bytef *strend = s->window + s->strstart + MAX_MATCH;

    /* The code is optimized for HASH_BITS >= 8 and MAX_MATCH-2 multiple of 16.
     * It is easy to get rid of this optimization if necessary.
     */
    Assert(s->hash_bits >= 8 && MAX_MATCH == 258, "Code too clever");

    Assert((ulg)s->strstart <= s->window_size-MIN_LOOKAHEAD, "need lookahead");

    Assert(cur_match < s->strstart, "no future");

    match = s->window + cur_match;

    /* Return failure if the match length is less than 2:
     */
    if (match[0] != scan[0] || match[1] != scan[1]) return MIN_MATCH-1;

    /* The check at best_len-1 can be removed because it will be made
     * again later. (This heuristic is not always a win.)
     * It is not necessary to compare scan[2] and match[2] since they
     * are always equal when the other bytes match, given that
     * the hash keys are equal and that HASH_BITS >= 8.
     */
    scan += 2, match += 2;
    Assert(*scan == *match, "match[2]?");

    /* We check for insufficient lookahead only every 8th comparison;
     * the 256th check will be made at strstart+258.
     */
    do {
    } while (*++scan == *++match && *++scan == *++match &&
             *++scan == *++match && *++scan == *++match &&
             *++scan == *++match && *++scan == *++match &&
             *++scan == *++match && *++scan == *++match &&
             scan < strend);

    Assert(scan <= s->window+(unsigned)(s->window_size-1), "wild scan");

    len = MAX_MATCH - (int)(strend - scan);

    if (len < MIN_MATCH) return MIN_MATCH - 1;

    s->match_start = cur_match;
    return (uInt)len <= s->lookahead ? (uInt)len : s->lookahead;
}